

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_rwkv_session::tokenize
          (llm_tokenizer_rwkv_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  naive_trie *this_00;
  naive_trie *pnVar1;
  long lVar2;
  ulong in_RSI;
  long in_RDI;
  uint32_t token_length;
  uint32_t token_id;
  naive_trie *node;
  uint32_t position;
  value_type_conflict3 *in_stack_ffffffffffffff98;
  naive_trie *in_stack_ffffffffffffffa0;
  uint local_34;
  naive_trie *local_28;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    this_00 = (naive_trie *)(ulong)local_1c;
    pnVar1 = (naive_trie *)std::__cxx11::string::size();
    if (pnVar1 <= this_00) break;
    lVar2 = *(long *)(in_RDI + 8) + 8;
    std::__cxx11::string::operator[](in_RSI);
    local_28 = naive_trie::traverse(this_00,(char)((ulong)lVar2 >> 0x38));
    if (local_28 == (naive_trie *)0x0) {
      llama_vocab::token_unk((llama_vocab *)0x541b9c);
      llama_vocab::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
      local_1c = local_1c + 1;
    }
    else {
      local_34 = 0;
      while (local_28 != (naive_trie *)0x0) {
        if ((local_28->has_value & 1U) != 0) {
          local_34 = local_1c + 1;
        }
        local_1c = local_1c + 1;
        std::__cxx11::string::operator[](in_RSI);
        pnVar1 = naive_trie::traverse(this_00,(char)((ulong)lVar2 >> 0x38));
        in_stack_ffffffffffffffa0 = local_28;
        local_28 = pnVar1;
      }
      llama_vocab::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
      local_1c = local_34;
    }
  }
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        uint32_t position = 0;
        while (position < text.size()) {
            const struct naive_trie * node = tokenizer.token_matcher.traverse(text[position]);
            if (node == NULL) {
                // no matching token found, add unknown token
                output.push_back(vocab.token_unk());
                position += 1;
                continue;
            }

            // traverse the trie to find the longest matching token
            uint32_t token_id = 0;
            uint32_t token_length = 0;
            while (node != NULL) {
                if (node->has_value) {
                    token_id = node->value;
                    token_length = position + 1;
                }
                node = node->traverse(text[++position]);
            }

            // add the longest matching token
            output.push_back(token_id);
            position = token_length;
        }
    }